

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLElement::QueryUnsignedText(XMLElement *this,uint *uval)

{
  bool bVar1;
  int iVar2;
  XMLNode *pXVar3;
  undefined4 extraout_var;
  char *str;
  char *t;
  uint *uval_local;
  XMLElement *this_local;
  
  pXVar3 = XMLNode::FirstChild(&this->super_XMLNode);
  if (pXVar3 != (XMLNode *)0x0) {
    pXVar3 = XMLNode::FirstChild(&this->super_XMLNode);
    iVar2 = (*pXVar3->_vptr_XMLNode[7])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      pXVar3 = XMLNode::FirstChild(&this->super_XMLNode);
      str = XMLNode::Value(pXVar3);
      bVar1 = XMLUtil::ToUnsigned(str,uval);
      if (!bVar1) {
        return XML_CAN_NOT_CONVERT_TEXT;
      }
      return XML_SUCCESS;
    }
  }
  return XML_NO_TEXT_NODE;
}

Assistant:

XMLError XMLElement::QueryUnsignedText( unsigned* uval ) const
{
    if ( FirstChild() && FirstChild()->ToText() ) {
        const char* t = FirstChild()->Value();
        if ( XMLUtil::ToUnsigned( t, uval ) ) {
            return XML_SUCCESS;
        }
        return XML_CAN_NOT_CONVERT_TEXT;
    }
    return XML_NO_TEXT_NODE;
}